

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O0

DecodeStatus
DecodeFGR32RegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,MCRegisterInfo *Decoder)

{
  uint Reg_00;
  uint Reg;
  MCRegisterInfo *Decoder_local;
  uint64_t Address_local;
  uint RegNo_local;
  MCInst *Inst_local;
  
  if (RegNo < 0x20) {
    Reg_00 = getReg(Decoder,5,RegNo);
    MCOperand_CreateReg0(Inst,Reg_00);
    Inst_local._4_4_ = MCDisassembler_Success;
  }
  else {
    Inst_local._4_4_ = MCDisassembler_Fail;
  }
  return Inst_local._4_4_;
}

Assistant:

static DecodeStatus DecodeFGR32RegisterClass(MCInst *Inst,
		unsigned RegNo, uint64_t Address, MCRegisterInfo *Decoder)
{
	unsigned Reg;

	if (RegNo > 31)
		return MCDisassembler_Fail;

	Reg = getReg(Decoder, Mips_FGR32RegClassID, RegNo);
	MCOperand_CreateReg0(Inst, Reg);
	return MCDisassembler_Success;
}